

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall CVmObjTable::restore(CVmObjTable *this,CVmFile *fp,CVmObjFixup **fixups)

{
  ulong uVar1;
  obj_fixup_entry *poVar2;
  char cVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  CVmObjFixup *pCVar7;
  ulong uVar8;
  ulong uVar9;
  CVmObjPageEntry **ppCVar10;
  uint uVar11;
  bool bVar12;
  char buf [2];
  
  *fixups = (CVmObjFixup *)0x0;
  iVar4 = CVmMetaTable::read_from_file(G_meta_table_X,fp);
  if (iVar4 == 0) {
    reset_to_image(&G_obj_table_X);
    uVar6 = CVmFile::read_uint4(fp);
    pCVar7 = (CVmObjFixup *)operator_new(0x20);
    CVmObjFixup::CVmObjFixup(pCVar7,uVar6);
    *fixups = pCVar7;
    while( true ) {
      uVar8 = CVmFile::read_uint4(fp);
      bVar12 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar12) break;
      uVar9 = CVmFile::read_uint4(fp);
      vVar5 = 0;
      if ((uVar9 & 1) == 0) {
        vVar5 = vm_new_id(0);
      }
      pCVar7 = *fixups;
      uVar1 = pCVar7->used_;
      pCVar7->used_ = uVar1 + 1;
      poVar2 = pCVar7->arr_[uVar1 >> 0xb];
      uVar11 = (uint)uVar1 & 0x7ff;
      poVar2[uVar11].old_id = (vm_obj_id_t)uVar8;
      poVar2[uVar11].new_id = vVar5;
    }
    while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
      uVar6 = CVmFile::read_uint4(fp);
      CVmFile::read_bytes(fp,buf,2);
      cVar3 = buf[1];
      uVar11 = (uint)uVar6;
      if (buf[0] == '\0') {
        vVar5 = CVmObjFixup::get_new_id(*fixups,uVar11);
        uVar6 = (ulong)vVar5;
        CVmMetaTable::create_for_restore(G_meta_table_X,(uint)(byte)cVar3,vVar5);
        ppCVar10 = this->pages_;
      }
      else {
        iVar4 = is_obj_id_valid(this,uVar11);
        if ((iVar4 == 0) ||
           (ppCVar10 = this->pages_,
           (ppCVar10[uVar6 >> 0xc & 0xfffff][uVar11 & 0xfff].field_0x14 & 1) != 0)) {
          return 0x4b6;
        }
      }
      uVar11 = (uint)uVar6 & 0xfff;
      (**(code **)(*(long *)&ppCVar10[uVar6 >> 0xc & 0xfffff][uVar11].ptr_ + 0xf0))
                (ppCVar10[uVar6 >> 0xc & 0xfffff] + uVar11,uVar6 & 0xffffffff,fp,*fixups);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int CVmObjTable::restore(VMG_ CVmFile *fp, CVmObjFixup **fixups)
{
    int err;
    ulong cnt;

    /* presume we won't create a fixup table */
    *fixups = 0;
    
    /* load the metaclass table */
    if ((err = G_meta_table->read_from_file(fp)) != 0)
        return err;

    /* 
     *   Reset all objects to the initial image file load state.  Note that
     *   we wait until after we've read the metaclass table to reset the
     *   objects, because any intrinsic class objects in the root set will
     *   need to re-initialize their presence in the metaclass table, which
     *   they can't do until after the metaclass table has itself been
     *   reloaded. 
     */
    G_obj_table->reset_to_image(vmg0_);

    /* read the size of the table of contents */
    cnt = fp->read_uint4();

    /* allocate the fixup table */
    *fixups = new CVmObjFixup(cnt);

    /* read the fixup table */
    for ( ; cnt != 0 ; --cnt)
    {
        vm_obj_id_t old_id;
        vm_obj_id_t new_id;
        ulong flags;
        
        /* read the next entry */
        old_id = (vm_obj_id_t)fp->read_uint4();
        flags = fp->read_uint4();
        
        /* 
         *   Allocate a new object ID for this entry.  If the object was
         *   transient, then it won't actually have been saved, so we must
         *   fix up references to the object to nil.  
         */
        if (!(flags & VMOBJ_TOC_TRANSIENT))
            new_id = vm_new_id(vmg_ FALSE);
        else
            new_id = VM_INVALID_OBJ;
        
        /* 
         *   Add the entry.  Note that the table of contents is stored in
         *   ascending order of old ID (i.e., the ID's in the saved state
         *   file's numbering system); this is the same ordering required by
         *   the fixup table, so we can simply read entries from the file
         *   and add them directly to the fixup table.  
         */
        (*fixups)->add_fixup(old_id, new_id);
    }
    
    /* read the number of saved objects */
    cnt = fp->read_uint4();
    
    /* read the objects */
    for ( ; cnt != 0 ; --cnt)
    {
        char buf[2];
        vm_obj_id_t id;
        int in_root_set;
        uint meta_idx;
        CVmObject *obj;
        
        /* read the original object ID */
        id = (vm_obj_id_t)fp->read_uint4();

        /* read the root-set flag and dependency table index */
        fp->read_bytes(buf, 2);
        in_root_set = buf[0];
        meta_idx = (uchar)buf[1];

        /* 
         *   if it's not in the root set, we need to create a new object;
         *   otherwise, the object must already exist, since it came from
         *   the object file 
         */
        if (in_root_set)
        {
            /* 
             *   make sure the object is valid - since it's supposedly in
             *   the root set, it must already exist 
             */
            if (!is_obj_id_valid(id) || get_entry(id)->free_)
                return VMERR_SAVED_OBJ_ID_INVALID;
        }
        else
        {
            /* 
             *   the object was dynamically allocated, so it will have a new
             *   object number - fix up the object ID to the new numbering
             *   system 
             */
            id = (*fixups)->get_new_id(vmg_ id);

            /* create the object */
            G_meta_table->create_for_restore(vmg_ meta_idx, id);
        }

        /* read the object's data */
        obj = get_obj(id);
        obj->restore_from_file(vmg_ id, fp, *fixups);
    }
    
    /* success */
    return 0;
}